

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_sort(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue obj_00;
  JSValue obj_01;
  JSValue val;
  JSValue val_00;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue obj_02;
  JSValue val_01;
  JSValue JVar1;
  int iVar2;
  ulong uVar3;
  JSValue *in_R8;
  JSValue JVar4;
  ValueSlot *new_array;
  size_t slack;
  size_t new_size;
  int present;
  int64_t undefined_count;
  int64_t len;
  int64_t i;
  size_t n;
  size_t pos;
  size_t array_size;
  ValueSlot *array;
  JSValue obj;
  array_sort_context asc;
  void *in_stack_00000430;
  cmp_f in_stack_00000438;
  size_t in_stack_00000440;
  size_t in_stack_00000448;
  void *in_stack_00000450;
  void *in_stack_fffffffffffffef8;
  JSContext *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  JSContext *in_stack_ffffffffffffff18;
  JSValueUnion in_stack_ffffffffffffff20;
  JSValueUnion in_stack_ffffffffffffff28;
  JSContext *in_stack_ffffffffffffff30;
  JSValueUnion in_stack_ffffffffffffff38;
  void *in_stack_ffffffffffffff40;
  JSValueUnion local_b8;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  JSContext *ctx_00;
  JSValueUnion in_stack_ffffffffffffff68;
  void *pvVar5;
  void *local_88;
  void *local_80;
  void *local_78;
  JSContext *pJVar6;
  JSValueUnion JVar7;
  int64_t iVar8;
  int32_t local_10;
  undefined4 uStack_c;
  JSValue *local_8;
  
  JVar7.float64 = 0.0;
  iVar8 = 3;
  pJVar6 = (JSContext *)0x0;
  local_78 = (void *)0x0;
  local_80 = (void *)0x0;
  local_88 = (void *)0x0;
  ctx_00 = (JSContext *)0x0;
  iVar2 = JS_IsUndefined(*in_R8);
  if ((iVar2 != 0) ||
     (JVar4.u._4_4_ = in_stack_ffffffffffffff14, JVar4.u.int32 = in_stack_ffffffffffffff10,
     JVar4.tag = (int64_t)in_stack_ffffffffffffff18,
     iVar2 = check_function((JSContext *)
                            CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),JVar4),
     iVar2 == 0)) {
    val_01.tag = iVar8;
    val_01.u.float64 = JVar7.float64;
    JVar4 = JS_ToObject(pJVar6,val_01);
    local_b8 = JVar4.u;
    obj_01.tag = (int64_t)in_stack_ffffffffffffff30;
    obj_01.u.float64 = in_stack_ffffffffffffff28.float64;
    local_8 = (JSValue *)JVar4.tag;
    iVar2 = js_get_length64((JSContext *)in_stack_ffffffffffffff20.ptr,
                            (int64_t *)in_stack_ffffffffffffff18,obj_01);
    if (iVar2 == 0) {
      for (pvVar5 = (void *)0x0; (long)pvVar5 < (long)in_stack_ffffffffffffff68.ptr;
          pvVar5 = (void *)((long)pvVar5 + 1)) {
        if (local_78 <= local_80) {
          uVar3 = (long)local_78 + ((ulong)local_78 >> 1) + 0x1f & 0xfffffffffffffff0;
          in_stack_ffffffffffffff30 =
               (JSContext *)
               js_realloc2((JSContext *)in_stack_ffffffffffffff38.ptr,in_stack_ffffffffffffff30,
                           (size_t)in_stack_ffffffffffffff28,(size_t *)in_stack_ffffffffffffff20.ptr
                          );
          if (in_stack_ffffffffffffff30 == (JSContext *)0x0) goto LAB_001b1b41;
          in_stack_ffffffffffffff40 = (void *)(((ulong)in_stack_ffffffffffffff38.ptr >> 5) + uVar3);
          local_78 = in_stack_ffffffffffffff40;
          pJVar6 = in_stack_ffffffffffffff30;
        }
        obj_02.tag = (int64_t)pvVar5;
        obj_02.u.ptr = in_stack_ffffffffffffff68.ptr;
        in_stack_ffffffffffffff5c =
             JS_TryGetPropertyInt64
                       (ctx_00,obj_02,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                        (JSValue *)JVar4.tag);
        if (in_stack_ffffffffffffff5c < 0) goto LAB_001b1b41;
        if (in_stack_ffffffffffffff5c != 0) {
          iVar2 = JS_IsUndefined(*(JSValue *)((long)&pJVar6->header + (long)local_80 * 0x20));
          if (iVar2 == 0) {
            *(undefined8 *)((long)&pJVar6->header + (long)local_80 * 0x20 + 0x10) = 0;
            pJVar6->native_error_proto[(long)local_80 * 2 + -8].u.ptr = pvVar5;
            local_80 = (void *)((long)local_80 + 1);
          }
          else {
            ctx_00 = (JSContext *)((long)&(ctx_00->header).ref_count + 1);
          }
        }
      }
      rqsort(in_stack_00000450,in_stack_00000448,in_stack_00000440,in_stack_00000438,
             in_stack_00000430);
      for (; local_88 < local_80; local_88 = (void *)((long)local_88 + 1)) {
        if (*(long *)((long)&pJVar6->header + (long)local_88 * 0x20 + 0x10) != 0) {
          in_stack_ffffffffffffff20 =
               (JSValueUnion)
               ((JSValueUnion *)((long)&pJVar6->header + (long)local_88 * 0x20 + 0x10))->ptr;
          in_stack_ffffffffffffff28.float64 = -NAN;
          v.u._4_4_ = in_stack_ffffffffffffff0c;
          v.u.int32 = in_stack_ffffffffffffff08;
          v.tag._0_4_ = in_stack_ffffffffffffff10;
          v.tag._4_4_ = in_stack_ffffffffffffff14;
          JS_FreeValue(in_stack_ffffffffffffff00,v);
        }
        if (pJVar6->native_error_proto[(long)local_88 * 2 + -8].u.ptr == local_88) {
          v_00.u._4_4_ = in_stack_ffffffffffffff0c;
          v_00.u.int32 = in_stack_ffffffffffffff08;
          v_00.tag._0_4_ = in_stack_ffffffffffffff10;
          v_00.tag._4_4_ = in_stack_ffffffffffffff14;
          JS_FreeValue(in_stack_ffffffffffffff00,v_00);
        }
        else {
          this_obj.tag = (int64_t)in_stack_ffffffffffffff40;
          this_obj.u.ptr = in_stack_ffffffffffffff38.ptr;
          val.tag = (int64_t)in_stack_ffffffffffffff30;
          val.u.ptr = in_stack_ffffffffffffff28.ptr;
          iVar2 = JS_SetPropertyInt64((JSContext *)in_stack_ffffffffffffff20.ptr,this_obj,
                                      (int64_t)in_stack_ffffffffffffff18,val);
          if (iVar2 < 0) {
            local_88 = (void *)((long)local_88 + 1);
            goto LAB_001b1b41;
          }
        }
      }
      js_free(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      while (pJVar6 = (JSContext *)((long)&ctx_00[-1].user_opaque + 7), 0 < (long)ctx_00) {
        in_stack_ffffffffffffff10 = 0;
        in_stack_ffffffffffffff18 = (JSContext *)0x3;
        this_obj_00.tag = (int64_t)in_stack_ffffffffffffff40;
        this_obj_00.u.ptr = in_stack_ffffffffffffff38.ptr;
        val_00.tag = (int64_t)in_stack_ffffffffffffff30;
        val_00.u.ptr = in_stack_ffffffffffffff28.ptr;
        iVar2 = JS_SetPropertyInt64((JSContext *)in_stack_ffffffffffffff20.ptr,this_obj_00,3,val_00)
        ;
        if (iVar2 < 0) goto LAB_001b1c10;
        local_88 = (void *)((long)local_88 + 1);
        ctx_00 = pJVar6;
      }
      for (; (long)local_88 < (long)in_stack_ffffffffffffff68.ptr;
          local_88 = (void *)((long)local_88 + 1)) {
        obj_00.tag = (int64_t)in_stack_ffffffffffffff28.ptr;
        obj_00.u.float64 = in_stack_ffffffffffffff20.float64;
        iVar2 = JS_DeletePropertyInt64
                          (in_stack_ffffffffffffff18,obj_00,
                           CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                           in_stack_ffffffffffffff0c);
        if (iVar2 < 0) goto LAB_001b1c10;
      }
      local_10 = local_b8.int32;
      uStack_c = local_b8._4_4_;
      goto LAB_001b1c44;
    }
  }
LAB_001b1b41:
  for (; local_88 < local_80; local_88 = (void *)((long)local_88 + 1)) {
    v_01.u._4_4_ = in_stack_ffffffffffffff0c;
    v_01.u.int32 = in_stack_ffffffffffffff08;
    v_01.tag._0_4_ = in_stack_ffffffffffffff10;
    v_01.tag._4_4_ = in_stack_ffffffffffffff14;
    JS_FreeValue(in_stack_ffffffffffffff00,v_01);
    if (*(long *)((long)&pJVar6->header + (long)local_88 * 0x20 + 0x10) != 0) {
      in_stack_ffffffffffffff00 =
           *(JSContext **)((long)&pJVar6->header + (long)local_88 * 0x20 + 0x10);
      in_stack_ffffffffffffff08 = 0xfffffff9;
      in_stack_ffffffffffffff0c = -1;
      v_02.tag._0_4_ = in_stack_ffffffffffffff10;
      v_02.u.float64 = -NAN;
      v_02.tag._4_4_ = in_stack_ffffffffffffff14;
      JS_FreeValue(in_stack_ffffffffffffff00,v_02);
    }
  }
  js_free(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
LAB_001b1c10:
  v_03.u._4_4_ = in_stack_ffffffffffffff0c;
  v_03.u.int32 = in_stack_ffffffffffffff08;
  v_03.tag._0_4_ = in_stack_ffffffffffffff10;
  v_03.tag._4_4_ = in_stack_ffffffffffffff14;
  JS_FreeValue(in_stack_ffffffffffffff00,v_03);
  local_10 = 0;
  local_8 = (JSValue *)0x6;
LAB_001b1c44:
  JVar1.u._4_4_ = uStack_c;
  JVar1.u.int32 = local_10;
  JVar1.tag = (int64_t)local_8;
  return JVar1;
}

Assistant:

static JSValue js_array_sort(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv)
{
    struct array_sort_context asc = { ctx, 0, 0, argv[0] };
    JSValue obj = JS_UNDEFINED;
    ValueSlot *array = NULL;
    size_t array_size = 0, pos = 0, n = 0;
    int64_t i, len, undefined_count = 0;
    int present;

    if (!JS_IsUndefined(asc.method)) {
        if (check_function(ctx, asc.method))
            goto exception;
        asc.has_method = 1;
    }
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    /* XXX: should special case fast arrays */
    for (i = 0; i < len; i++) {
        if (pos >= array_size) {
            size_t new_size, slack;
            ValueSlot *new_array;
            new_size = (array_size + (array_size >> 1) + 31) & ~15;
            new_array = js_realloc2(ctx, array, new_size * sizeof(*array), &slack);
            if (new_array == NULL)
                goto exception;
            new_size += slack / sizeof(*new_array);
            array = new_array;
            array_size = new_size;
        }
        present = JS_TryGetPropertyInt64(ctx, obj, i, &array[pos].val);
        if (present < 0)
            goto exception;
        if (present == 0)
            continue;
        if (JS_IsUndefined(array[pos].val)) {
            undefined_count++;
            continue;
        }
        array[pos].str = NULL;
        array[pos].pos = i;
        pos++;
    }
    rqsort(array, pos, sizeof(*array), js_array_cmp_generic, &asc);
    if (asc.exception)
        goto exception;

    /* XXX: should special case fast arrays */
    while (n < pos) {
        if (array[n].str)
            JS_FreeValue(ctx, JS_MKPTR(JS_TAG_STRING, array[n].str));
        if (array[n].pos == n) {
            JS_FreeValue(ctx, array[n].val);
        } else {
            if (JS_SetPropertyInt64(ctx, obj, n, array[n].val) < 0) {
                n++;
                goto exception;
            }
        }
        n++;
    }
    js_free(ctx, array);
    for (i = n; undefined_count-- > 0; i++) {
        if (JS_SetPropertyInt64(ctx, obj, i, JS_UNDEFINED) < 0)
            goto fail;
    }
    for (; i < len; i++) {
        if (JS_DeletePropertyInt64(ctx, obj, i, JS_PROP_THROW) < 0)
            goto fail;
    }
    return obj;

exception:
    for (; n < pos; n++) {
        JS_FreeValue(ctx, array[n].val);
        if (array[n].str)
            JS_FreeValue(ctx, JS_MKPTR(JS_TAG_STRING, array[n].str));
    }
    js_free(ctx, array);
fail:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}